

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void fp_prepare_enc_workers(AV1_COMP *cpi,AVxWorkerHook hook,int num_workers)

{
  int iVar1;
  macroblock *mb;
  uint16_t *puVar2;
  int in_EDX;
  tran_low_t *in_RSI;
  long in_RDI;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  MultiThreadInfo *mt_info;
  AV1_COMMON *cm;
  undefined4 in_stack_ffffffffffffffd0;
  
  for (iVar1 = in_EDX + -1; -1 < iVar1; iVar1 = iVar1 + -1) {
    mb = (macroblock *)(*(long *)(in_RDI + 0x9ae80) + (long)iVar1 * 0x38);
    puVar2 = (uint16_t *)(*(long *)(in_RDI + 0x9ae88) + (long)iVar1 * 0x1d0);
    mb->plane[0].coeff = in_RSI;
    mb->plane[0].eobs = puVar2;
    mb->plane[0].txb_entropy_ctx = (uint8_t *)0x0;
    *(int *)(puVar2 + 0xe6) = iVar1;
    *(int *)(puVar2 + 0xe4) = iVar1;
    *(long *)puVar2 = in_RDI;
    if (iVar1 == 0) {
      *(long *)(puVar2 + 4) = in_RDI + 0x15030;
    }
    else {
      *(long *)(puVar2 + 4) = *(long *)(puVar2 + 8);
      memcpy(*(void **)(puVar2 + 4),(void *)(in_RDI + 0x15030),0x256b0);
    }
    av1_alloc_src_diff_buf((AV1Common *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),mb);
  }
  return;
}

Assistant:

static inline void fp_prepare_enc_workers(AV1_COMP *cpi, AVxWorkerHook hook,
                                          int num_workers) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &mt_info->workers[i];
    EncWorkerData *const thread_data = &mt_info->tile_thr_data[i];

    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = NULL;

    thread_data->thread_id = i;
    // Set the starting tile for each thread.
    thread_data->start = i;

    thread_data->cpi = cpi;
    if (i == 0) {
      thread_data->td = &cpi->td;
    } else {
      thread_data->td = thread_data->original_td;
      // Before encoding a frame, copy the thread data from cpi.
      thread_data->td->mb = cpi->td.mb;
    }
    av1_alloc_src_diff_buf(cm, &thread_data->td->mb);
  }
}